

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O1

void test_bhdct_update_empty_single_string_key(planck_unit_test_t *tc)

{
  char key [9];
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  undefined4 local_94;
  char local_90 [16];
  ion_dictionary_t local_80;
  ion_dictionary_handler_t local_68;
  
  local_90[8] = 0;
  local_90[0] = '\0';
  local_90[1] = '\0';
  local_90[2] = '\0';
  local_90[3] = '\0';
  local_90[4] = '\0';
  local_90[5] = '\0';
  local_90[6] = '\0';
  local_90[7] = '\0';
  bhdct_setup_string_key(tc,&local_68,&local_80,ion_fill_none);
  sprintf(local_90,"k%d",3);
  local_94 = 5;
  bhdct_update(tc,&local_80,local_90,&local_94,'\0',1,'\x01');
  bhdct_delete_dictionary(tc,&local_80);
  bhdct_close_master_table(tc);
  bhdct_delete_master_table(tc);
  return;
}

Assistant:

void
test_bhdct_update_empty_single_string_key(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;
	char						key[ION_BHDCT_STRING_KEY_BUFFER_SIZE] = { 0 };

	bhdct_setup_string_key(tc, &handler, &dict, ion_fill_none);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, 3);
	bhdct_update(tc, &dict, key, IONIZE(5, int), err_ok, 1, boolean_true);

	bhdct_takedown(tc, &dict);
}